

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

Status __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolver::ParseTypeUrl
          (DescriptorPoolTypeResolver *this,string_view type_url,string *type_name)

{
  char *pcVar1;
  char *__s2;
  char *__n;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_type __rlen;
  string *in_R8;
  AlphaNum *in_R9;
  bool bVar5;
  string_view message;
  string local_110;
  long *local_f0;
  char *local_e8;
  long local_e0 [4];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  pcVar4 = type_url._M_str;
  __s2 = *(char **)(type_url._M_len + 8);
  __n = *(char **)(type_url._M_len + 0x10);
  if (__n == (char *)0x0) {
    bVar5 = true;
  }
  else if (pcVar4 < __n) {
    bVar5 = false;
  }
  else {
    iVar2 = bcmp(type_name,__s2,(size_t)__n);
    bVar5 = iVar2 == 0;
  }
  pcVar3 = (char *)0x0;
  if (bVar5) {
    pcVar3 = __n;
  }
  if (((bool)(pcVar3 != pcVar4 & bVar5)) &&
     (pcVar1 = pcVar3 + (long)&type_name->_M_dataplus, *pcVar1 == '/')) {
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,pcVar1 + 1,pcVar1 + ~(ulong)pcVar3 + 1 + (long)pcVar4);
    std::__cxx11::string::operator=(in_R8,(string *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    (this->super_TypeResolver)._vptr_TypeResolver = (_func_int **)0x1;
  }
  else {
    local_f0 = (long *)0x31;
    local_e8 = "Invalid type URL, type URLs must be of the form \'";
    local_90.piece_._M_len = 0x13;
    local_90.piece_._M_str = "/<typename>\', got: ";
    local_c0.piece_._M_len = (size_t)pcVar4;
    local_c0.piece_._M_str = (char *)type_name;
    local_60.piece_._M_len = (size_t)__n;
    local_60.piece_._M_str = __s2;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_110,(lts_20250127 *)&local_f0,&local_60,&local_90,&local_c0,in_R9);
    message._M_str = (char *)local_110._M_string_length;
    message._M_len = (size_t)this;
    absl::lts_20250127::InvalidArgumentError(message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseTypeUrl(absl::string_view type_url,
                            std::string* type_name) {
    absl::string_view stripped = type_url;
    if (!absl::ConsumePrefix(&stripped, url_prefix_) ||
        !absl::ConsumePrefix(&stripped, "/")) {
      return absl::InvalidArgumentError(
          absl::StrCat("Invalid type URL, type URLs must be of the form '",
                       url_prefix_, "/<typename>', got: ", type_url));
    }
    *type_name = std::string(stripped);
    return absl::Status();
  }